

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O0

void dispatch_queue(harbor *h,int id)

{
  int fd_00;
  harbor_msg_queue *queue_00;
  slave *psVar1;
  harbor_msg *cookie;
  harbor_msg *m;
  harbor_msg_queue *queue;
  int fd;
  slave *s;
  int id_local;
  harbor *h_local;
  
  psVar1 = h->s + id;
  fd_00 = psVar1->fd;
  if (fd_00 == 0) {
    __assert_fail("fd != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/service-src/service_harbor.c"
                  ,0x180,"void dispatch_queue(struct harbor *, int)");
  }
  queue_00 = psVar1->queue;
  if (queue_00 != (harbor_msg_queue *)0x0) {
    while (cookie = pop_queue(queue_00), cookie != (harbor_msg *)0x0) {
      send_remote(h->ctx,fd_00,(char *)cookie->buffer,cookie->size,&cookie->header);
      free(cookie->buffer);
    }
    release_queue(queue_00);
    psVar1->queue = (harbor_msg_queue *)0x0;
  }
  return;
}

Assistant:

static void
dispatch_queue(struct harbor *h, int id) {
	struct slave *s = &h->s[id];
	int fd = s->fd;
	assert(fd != 0);

	struct harbor_msg_queue *queue = s->queue;
	if (queue == NULL)
		return;

	struct harbor_msg * m;
	while ((m = pop_queue(queue)) != NULL) {
		send_remote(h->ctx, fd, m->buffer, m->size, &m->header);
		skynet_free(m->buffer);
	}
	release_queue(queue);
	s->queue = NULL;
}